

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

void display_array(int *p,int size,int nl,FILE *fp)

{
  int iVar1;
  char *__ptr;
  ulong uVar2;
  
  if (0 < size) {
    uVar2 = 0;
    do {
      iVar1 = p[uVar2];
      if (iVar1 == -10000000) {
        __ptr = "  -INf";
LAB_00128343:
        fwrite(__ptr,6,1,(FILE *)fp);
      }
      else {
        if (iVar1 == -0x32) {
          __ptr = "   DEF";
          goto LAB_00128343;
        }
        if (iVar1 == 10000000) {
          __ptr = "   INF";
          goto LAB_00128343;
        }
        fprintf((FILE *)fp,"%6d");
      }
      uVar2 = uVar2 + 1;
      if ((int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) % (long)nl)
          == 0) {
        fputc(10,(FILE *)fp);
      }
    } while (size != (int)uVar2);
  }
  if ((uint)size % (uint)nl != 0) {
    fputc(10,(FILE *)fp);
    return;
  }
  return;
}

Assistant:

PRIVATE void
display_array(int   *p,
              int   size,
              int   nl,
              FILE  *fp)
{
  int i;

  for (i = 1; i <= size; i++, p++) {
    switch (*p) {
      case  INF:
        fprintf(fp, "   INF");
        break;
      case -INF:
        fprintf(fp, "  -INf");
        break;
      case  DEF:
        fprintf(fp, "   DEF");
        break;
      default:
        fprintf(fp, "%6d", *p);
        break;
    }
    if ((i % nl) == 0)
      fprintf(fp, "\n");
  }
  if (size % nl)
    fprintf(fp, "\n");

  return;
}